

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O1

void __thiscall
duckdb::UngroupedAggregateLocalSinkState::~UngroupedAggregateLocalSinkState
          (UngroupedAggregateLocalSinkState *this)

{
  pointer ppEVar1;
  
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__UngroupedAggregateLocalSinkState_024a1390;
  ::std::
  vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>_>_>
  ::~vector(&(this->radix_states).
             super_vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>_>_>
           );
  ::std::
  vector<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>_>_>
             *)&(this->execute_state).filter_set);
  DataChunk::~DataChunk(&(this->execute_state).aggregate_input_chunk);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
  ::~vector(&(this->execute_state).child_executor.states.
             super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
           );
  ppEVar1 = (this->execute_state).child_executor.expressions.
            super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
            super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1);
  }
  UngroupedAggregateState::~UngroupedAggregateState(&(this->state).state);
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__LocalSinkState_024811c0;
  ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::~vector
            (&(this->super_LocalSinkState).partition_info.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            );
  operator_delete(this);
  return;
}

Assistant:

UngroupedAggregateLocalSinkState(const PhysicalUngroupedAggregate &op, const vector<LogicalType> &child_types,
	                                 UngroupedAggregateGlobalSinkState &gstate_p, ExecutionContext &context)
	    : state(gstate_p.state), execute_state(context.client, op.aggregates, child_types) {
		auto &gstate = gstate_p.Cast<UngroupedAggregateGlobalSinkState>();
		InitializeDistinctAggregates(op, gstate, context);
	}